

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionNextChar.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionNextChar::InstructionNextChar(InstructionNextChar *this,Context *cx,bool beg)

{
  Context CStack_88;
  
  Context::Context(&CStack_88,cx);
  Instruction::Instruction(&this->super_Instruction,&CStack_88);
  Context::~Context(&CStack_88);
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR__Instruction_001973c8;
  (this->super_Instruction).field_0x174 = beg;
  return;
}

Assistant:

InstructionNextChar::InstructionNextChar( const Context &cx, bool beg ) : Instruction( cx ), beg( beg ) {
}